

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Options::SharedCtor(Options *this)

{
  google::protobuf::internal::InitSCC(&scc_info_Options_bloaty_2eproto.base);
  (this->disassemble_function_).ptr_ =
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->source_filter_).ptr_ =
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->demangle_ = 0;
  this->sort_by_ = 0;
  this->verbose_level_ = 0;
  this->dump_raw_map_ = false;
  *(undefined3 *)&this->field_0xc5 = 0;
  this->debug_vmaddr_ = 0;
  this->debug_fileoff_ = 0;
  this->max_rows_per_level_ = 0x14;
  return;
}

Assistant:

void Options::SharedCtor() {
  ::PROTOBUF_NAMESPACE_ID::internal::InitSCC(&scc_info_Options_bloaty_2eproto.base);
  disassemble_function_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  source_filter_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  ::memset(&demangle_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&debug_fileoff_) -
      reinterpret_cast<char*>(&demangle_)) + sizeof(debug_fileoff_));
  max_rows_per_level_ = PROTOBUF_LONGLONG(20);
}